

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

void amrex::MLLinOp::Initialize(void)

{
  ParmParse pp;
  allocator local_81;
  string local_80;
  ParmParse local_60;
  
  std::__cxx11::string::string((string *)&local_80,"mg",&local_81);
  ParmParse::ParmParse(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  ParmParse::queryAdd<int,_0>
            (&local_60,"consolidation_threshold",&(anonymous_namespace)::consolidation_threshold);
  ParmParse::queryAdd<int,_0>
            (&local_60,"consolidation_ratio",&(anonymous_namespace)::consolidation_ratio);
  ParmParse::queryAdd<int,_0>
            (&local_60,"consolidation_strategy",&(anonymous_namespace)::consolidation_strategy);
  ParmParse::queryAdd<int,_0>(&local_60,"verbose_linop",&(anonymous_namespace)::flag_verbose_linop);
  ParmParse::queryAdd<int,_0>(&local_60,"comm_cache",&(anonymous_namespace)::flag_comm_cache);
  ParmParse::queryAdd<int,_0>(&local_60,"mota",&(anonymous_namespace)::flag_use_mota);
  ParmParse::queryAdd<int,_0>(&local_60,"remap_nbh_lb",&(anonymous_namespace)::remap_nbh_lb);
  ExecOnFinalize((PTR_TO_VOID_FUNC)0x5daa13);
  (anonymous_namespace)::initialized = 1;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_60);
  return;
}

Assistant:

void MLLinOp::Initialize ()
{
    ParmParse pp("mg");
    pp.queryAdd("consolidation_threshold", consolidation_threshold);
    pp.queryAdd("consolidation_ratio", consolidation_ratio);
    pp.queryAdd("consolidation_strategy", consolidation_strategy);
    pp.queryAdd("verbose_linop", flag_verbose_linop);
    pp.queryAdd("comm_cache", flag_comm_cache);
    pp.queryAdd("mota", flag_use_mota);
    pp.queryAdd("remap_nbh_lb", remap_nbh_lb);

#ifdef BL_USE_MPI
    comm_cache = std::make_unique<CommCache>();
#endif
    amrex::ExecOnFinalize(MLLinOp::Finalize);
    initialized = true;
}